

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fees.cpp
# Opt level: O0

bool __thiscall CBlockPolicyEstimator::Write(CBlockPolicyEstimator *this,AutoFile *fileout)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  long in_FS_OFFSET;
  exception *anon_var_0;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock6;
  Mutex *in_stack_ffffffffffffff28;
  CBlockPolicyEstimator *in_stack_ffffffffffffff30;
  AutoFile *in_stack_ffffffffffffff38;
  undefined8 in_stack_ffffffffffffff48;
  char *in_stack_ffffffffffffff50;
  AutoFile *in_stack_ffffffffffffff58;
  TxConfirmStats *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld(in_stack_ffffffffffffff28);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
             (AnnotatedMixin<std::mutex> *)in_stack_ffffffffffffff60,
             (char *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
             (int)((ulong)in_stack_ffffffffffffff48 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffff48 >> 0x18,0));
  AutoFile::operator<<(in_stack_ffffffffffffff38,(int *)in_stack_ffffffffffffff30);
  AutoFile::operator<<(in_stack_ffffffffffffff38,(int *)in_stack_ffffffffffffff30);
  AutoFile::operator<<(in_stack_ffffffffffffff38,(uint *)in_stack_ffffffffffffff30);
  uVar2 = BlockSpan(in_stack_ffffffffffffff30);
  uVar3 = HistoricalBlockSpan(in_stack_ffffffffffffff30);
  if (uVar3 >> 1 < uVar2) {
    in_stack_ffffffffffffff60 =
         (TxConfirmStats *)
         AutoFile::operator<<(in_stack_ffffffffffffff38,(uint *)in_stack_ffffffffffffff30);
    AutoFile::operator<<(in_stack_ffffffffffffff38,(uint *)in_stack_ffffffffffffff30);
  }
  else {
    in_stack_ffffffffffffff58 =
         AutoFile::operator<<(in_stack_ffffffffffffff38,(uint *)in_stack_ffffffffffffff30);
    AutoFile::operator<<(in_stack_ffffffffffffff38,(uint *)in_stack_ffffffffffffff30);
  }
  Using<VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter>,std::vector<double,std::allocator<double>>const&>
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff30);
  AutoFile::operator<<
            (in_stack_ffffffffffffff38,
             (Wrapper<VectorFormatter<(anonymous_namespace)::EncodedDoubleFormatter>,_const_std::vector<double,_std::allocator<double>_>_&>
              *)in_stack_ffffffffffffff30);
  std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::operator->
            ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
             in_stack_ffffffffffffff28);
  TxConfirmStats::Write(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::operator->
            ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
             in_stack_ffffffffffffff28);
  TxConfirmStats::Write(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_>::operator->
            ((unique_ptr<TxConfirmStats,_std::default_delete<TxConfirmStats>_> *)
             in_stack_ffffffffffffff28);
  TxConfirmStats::Write(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_ffffffffffffff28);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return true;
  }
  __stack_chk_fail();
}

Assistant:

bool CBlockPolicyEstimator::Write(AutoFile& fileout) const
{
    try {
        LOCK(m_cs_fee_estimator);
        fileout << 149900; // version required to read: 0.14.99 or later
        fileout << CLIENT_VERSION; // version that wrote the file
        fileout << nBestSeenHeight;
        if (BlockSpan() > HistoricalBlockSpan()/2) {
            fileout << firstRecordedHeight << nBestSeenHeight;
        }
        else {
            fileout << historicalFirst << historicalBest;
        }
        fileout << Using<VectorFormatter<EncodedDoubleFormatter>>(buckets);
        feeStats->Write(fileout);
        shortStats->Write(fileout);
        longStats->Write(fileout);
    }
    catch (const std::exception&) {
        LogPrintf("CBlockPolicyEstimator::Write(): unable to write policy estimator data (non-fatal)\n");
        return false;
    }
    return true;
}